

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const,Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>
               (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false> *dst,
               Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>
               *lhs,Matrix<float,__1,__1,_0,__1,__1> *rhs,Scalar *alpha)

{
  float fVar1;
  float *pfVar2;
  ReturnType RVar3;
  LhsNested actual_lhs;
  undefined1 local_c8 [40];
  variable_if_dynamic<long,__1> vStack_a0;
  XprTypeNested local_98;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_58 [56];
  
  if ((rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols == 1)
  {
    fVar1 = *alpha;
    BlockImpl_dense<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_1,_-1,_true,_true>
    ::BlockImpl_dense((BlockImpl_dense<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_1,__1,_true,_true>
                       *)local_c8,lhs,0);
    Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,rhs,0);
    RVar3 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const,1,-1,true>>
            ::dot<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const,1,_1,true>>
                        *)local_c8,local_58);
    pfVar2 = (dst->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
             m_data;
    *pfVar2 = RVar3 * fVar1 + *pfVar2;
  }
  else {
    local_98.m_matrix =
         (non_const_type)
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_outerStride;
    local_c8._0_8_ =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
         .m_data;
    local_c8._8_8_ =
         *(undefined8 *)
          &(lhs->
           super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
           .field_0x8;
    local_c8._16_8_ =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
         .m_cols.m_value;
    local_c8._24_8_ =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_xpr.m_matrix;
    local_c8._32_8_ =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_startRow.m_value;
    vStack_a0.m_value =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_startCol.m_value;
    gemv_dense_selector<1,0,true>::
    run<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>
              ((Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>
                *)local_c8,rhs,dst,alpha);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }